

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::SetSolverType(ChSystem *this,Type type)

{
  ChLog *this_00;
  __shared_ptr<chrono::ChSolverSparseLU,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  if (type != CUSTOM) {
    std::make_shared<chrono::ChSystemDescriptor>();
    std::__shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->descriptor).
                super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
    switch(type) {
    case PSOR:
      std::make_shared<chrono::ChSolverPSOR>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverPSOR,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
      break;
    case PSSOR:
      std::make_shared<chrono::ChSolverPSSOR>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverPSSOR,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
      break;
    case PJACOBI:
      std::make_shared<chrono::ChSolverPJacobi>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverPJacobi,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
      break;
    case PMINRES:
      std::make_shared<chrono::ChSolverPMINRES>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverPMINRES,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
      break;
    case BARZILAIBORWEIN:
      std::make_shared<chrono::ChSolverBB>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverBB,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
      break;
    case APGD:
      std::make_shared<chrono::ChSolverAPGD>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverAPGD,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
      break;
    default:
      this_00 = GetLog();
      ChStreamOutAscii::operator<<
                (&this_00->super_ChStreamOutAscii,
                 "Solver type not supported. Use SetSolver instead.\n");
      return;
    case SPARSE_LU:
      std::make_shared<chrono::ChSolverSparseLU>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 &_Stack_28);
      break;
    case SPARSE_QR:
      std::make_shared<chrono::ChSolverSparseQR>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverSparseQR,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
      break;
    case GMRES:
      std::make_shared<chrono::ChSolverGMRES>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverGMRES,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
      break;
    case MINRES:
      std::make_shared<chrono::ChSolverMINRES>();
      std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> *)&this->solver,
                 (__shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_28);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  return;
}

Assistant:

void ChSystem::SetSolverType(ChSolver::Type type) {
    // Do nothing if changing to a CUSTOM solver.
    if (type == ChSolver::Type::CUSTOM)
        return;

    descriptor = chrono_types::make_shared<ChSystemDescriptor>();

    switch (type) {
        case ChSolver::Type::PSOR:
            solver = chrono_types::make_shared<ChSolverPSOR>();
            break;
        case ChSolver::Type::PSSOR:
            solver = chrono_types::make_shared<ChSolverPSSOR>();
            break;
        case ChSolver::Type::PJACOBI:
            solver = chrono_types::make_shared<ChSolverPJacobi>();
            break;
        case ChSolver::Type::PMINRES:
            solver = chrono_types::make_shared<ChSolverPMINRES>();
            break;
        case ChSolver::Type::BARZILAIBORWEIN:
            solver = chrono_types::make_shared<ChSolverBB>();
            break;
        case ChSolver::Type::APGD:
            solver = chrono_types::make_shared<ChSolverAPGD>();
            break;
        case ChSolver::Type::GMRES:
            solver = chrono_types::make_shared<ChSolverGMRES>();
            break;
        case ChSolver::Type::MINRES:
            solver = chrono_types::make_shared<ChSolverMINRES>();
            break;
        case ChSolver::Type::SPARSE_LU:
            solver = chrono_types::make_shared<ChSolverSparseLU>();
            break;
        case ChSolver::Type::SPARSE_QR:
            solver = chrono_types::make_shared<ChSolverSparseQR>();
            break;
        default:
            GetLog() << "Solver type not supported. Use SetSolver instead.\n";
            break;
    }
}